

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# timer.h
# Opt level: O2

void __thiscall
BCLog::Timer<std::chrono::duration<long,_std::ratio<1L,_1000L>_>_>::~Timer
          (Timer<std::chrono::duration<long,_std::ratio<1L,_1000L>_>_> *this)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RCX;
  long in_FS_OFFSET;
  allocator<char> local_31;
  string local_30;
  long local_10;
  
  local_10 = *(long *)(in_FS_OFFSET + 0x28);
  if (this->m_message_on_completion == true) {
    tinyformat::format<std::__cxx11::string>
              (&local_30,(tinyformat *)"%s completed",(char *)&this->m_title,in_RCX);
    Log(this,&local_30);
  }
  else {
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_30,"completed",&local_31);
    Log(this,&local_30);
  }
  std::__cxx11::string::~string((string *)&local_30);
  std::__cxx11::string::~string((string *)&this->m_title);
  std::__cxx11::string::~string((string *)&this->m_prefix);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_10) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

~Timer()
    {
        if (m_message_on_completion) {
            this->Log(strprintf("%s completed", m_title));
        } else {
            this->Log("completed");
        }
    }